

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LGetInfo(uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  undefined4 *in_R8;
  VP8LBitReader br;
  int a;
  int h;
  int w;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  VP8LBitReader *in_stack_ffffffffffffffa8;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  int local_4;
  
  if ((in_RDI == (uint8_t *)0x0) || (in_RSI < 5)) {
    local_4 = 0;
  }
  else {
    iVar1 = VP8LCheckSignature(in_RDI,in_RSI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      VP8LInitBitReader((VP8LBitReader *)&stack0xffffffffffffff98,in_RDI,in_RSI);
      iVar1 = ReadImageInfo(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98,(int *)0x112f81);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        if (in_RDX != (undefined4 *)0x0) {
          *in_RDX = local_34;
        }
        if (in_RCX != (undefined4 *)0x0) {
          *in_RCX = local_38;
        }
        if (in_R8 != (undefined4 *)0x0) {
          *in_R8 = local_3c;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int VP8LGetInfo(const uint8_t* data, size_t data_size,
                int* const width, int* const height, int* const has_alpha) {
  if (data == NULL || data_size < VP8L_FRAME_HEADER_SIZE) {
    return 0;         // not enough data
  } else if (!VP8LCheckSignature(data, data_size)) {
    return 0;         // bad signature
  } else {
    int w, h, a;
    VP8LBitReader br;
    VP8LInitBitReader(&br, data, data_size);
    if (!ReadImageInfo(&br, &w, &h, &a)) {
      return 0;
    }
    if (width != NULL) *width = w;
    if (height != NULL) *height = h;
    if (has_alpha != NULL) *has_alpha = a;
    return 1;
  }
}